

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O0

void __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerRegistrar
          (ListenerRegistrar<Catch2ApprovalListener> *this,StringRef listenerName)

{
  StringRef *in_RDX;
  unique_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory>
  *in_stack_ffffffffffffffb8;
  unique_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory> *this_00;
  unique_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory> local_28;
  unique_ptr<Catch::EventListenerFactory> *in_stack_ffffffffffffffe0;
  
  this_00 = &local_28;
  Detail::
  make_unique<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory,Catch::StringRef&>
            (in_RDX);
  Detail::unique_ptr<Catch::EventListenerFactory>::
  unique_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory,void>
            ((unique_ptr<Catch::EventListenerFactory> *)this_00,in_stack_ffffffffffffffb8);
  Detail::registerListenerImpl(in_stack_ffffffffffffffe0);
  Detail::unique_ptr<Catch::EventListenerFactory>::~unique_ptr
            ((unique_ptr<Catch::EventListenerFactory> *)this_00);
  Detail::unique_ptr<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory>::
  ~unique_ptr(this_00);
  return;
}

Assistant:

ListenerRegistrar(StringRef listenerName) {
            registerListenerImpl( Detail::make_unique<TypedListenerFactory>(listenerName) );
        }